

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * __thiscall
pbrt::Image::GaussianFilter
          (Image *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,int halfWidth,
          Float sigma)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  byte bVar17;
  byte bVar18;
  pointer pbVar19;
  iterator __begin1;
  Allocator AVar20;
  int iVar21;
  float *pfVar22;
  long lVar23;
  ulong uVar24;
  ushort uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  int nc;
  Image *blury;
  vector<float,_std::allocator<float>_> wts;
  Image blurx;
  uint local_164;
  float local_160;
  undefined4 local_15c;
  Image *local_158;
  uint local_150;
  float local_14c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<float,_std::allocator<float>_> local_130;
  _Any_data local_118;
  code *pcStack_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *pcStack_e8;
  code *pcStack_e0;
  ColorEncodingHandle local_d8;
  ColorEncodingHandle local_d0;
  Image local_c8;
  
  local_c8.format = U256;
  local_164 = halfWidth;
  local_160 = sigma;
  local_158 = __return_storage_ptr__;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_130,(long)(halfWidth * 2 + 1),(value_type_conflict *)&local_c8,
             (allocator_type *)&local_148);
  uVar24 = (ulong)local_164;
  if (-1 < (int)local_164) {
    fVar34 = local_160 * 6.2831855 * local_160;
    fVar35 = (local_160 + local_160) * local_160;
    auVar32 = vsqrtss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
    auVar36 = ZEXT1664(auVar32);
    local_150 = auVar32._0_4_;
    lVar23 = 0;
    local_160 = fVar35;
    local_14c = fVar34;
    do {
      fVar31 = auVar36._0_4_;
      if (fVar34 < 0.0) {
        fVar31 = sqrtf(fVar34);
        auVar36 = ZEXT464(local_150);
        fVar35 = local_160;
        fVar34 = local_14c;
      }
      fVar33 = (float)((int)lVar23 - (int)uVar24);
      fVar33 = ((fVar33 * fVar33) / fVar35) * -1.442695;
      auVar32 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),9);
      fVar33 = fVar33 - auVar32._0_4_;
      auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar33),
                                SUB6416(ZEXT464(0x3e679a0b),0));
      auVar16 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar33),SUB6416(ZEXT464(0x3f321004),0));
      auVar16 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar33),SUB6416(ZEXT464(0x3f800000),0));
      iVar21 = (int)auVar32._0_4_ + -0x7f + (auVar16._0_4_ >> 0x17);
      fVar33 = 0.0;
      if ((-0x7f < iVar21) && (fVar33 = INFINITY, iVar21 < 0x80)) {
        fVar33 = (float)(iVar21 * 0x800000 + 0x3f800000U | auVar16._0_4_ & 0x807fffff);
      }
      local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar23] = (1.0 / fVar31) * fVar33;
      uVar24 = (ulong)(int)local_164;
      bVar2 = lVar23 < (long)(uVar24 * 2);
      lVar23 = lVar23 + 1;
    } while (bVar2);
  }
  auVar32 = ZEXT816(0) << 0x40;
  auVar36 = ZEXT1664(auVar32);
  for (pfVar22 = local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pfVar22 !=
      local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish; pfVar22 = pfVar22 + 1) {
    fVar34 = auVar36._0_4_ + *pfVar22;
    auVar36 = ZEXT464((uint)fVar34);
    auVar32 = ZEXT416((uint)fVar34);
  }
  if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    auVar36 = vpbroadcastq_avx512f();
    auVar36 = vpsrlq_avx512f(auVar36,2);
    auVar26 = vbroadcastss_avx512f(auVar32);
    uVar24 = 0;
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar29 = vpbroadcastq_avx512f();
      auVar30 = vporq_avx512f(auVar29,auVar27);
      auVar29 = vporq_avx512f(auVar29,auVar28);
      uVar15 = vpcmpuq_avx512f(auVar29,auVar36,2);
      bVar17 = (byte)uVar15;
      uVar15 = vpcmpuq_avx512f(auVar30,auVar36,2);
      bVar18 = (byte)uVar15;
      uVar25 = CONCAT11(bVar18,bVar17);
      pfVar22 = local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + uVar24;
      auVar29._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * (int)pfVar22[1];
      auVar29._0_4_ = (uint)(bVar17 & 1) * (int)*pfVar22;
      auVar29._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * (int)pfVar22[2];
      auVar29._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * (int)pfVar22[3];
      auVar29._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * (int)pfVar22[4];
      auVar29._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * (int)pfVar22[5];
      auVar29._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * (int)pfVar22[6];
      auVar29._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * (int)pfVar22[7];
      auVar29._32_4_ = (uint)(bVar18 & 1) * (int)pfVar22[8];
      auVar29._36_4_ = (uint)(bVar18 >> 1 & 1) * (int)pfVar22[9];
      auVar29._40_4_ = (uint)(bVar18 >> 2 & 1) * (int)pfVar22[10];
      auVar29._44_4_ = (uint)(bVar18 >> 3 & 1) * (int)pfVar22[0xb];
      auVar29._48_4_ = (uint)(bVar18 >> 4 & 1) * (int)pfVar22[0xc];
      auVar29._52_4_ = (uint)(bVar18 >> 5 & 1) * (int)pfVar22[0xd];
      auVar29._56_4_ = (uint)(bVar18 >> 6 & 1) * (int)pfVar22[0xe];
      auVar29._60_4_ = (uint)(bVar18 >> 7) * (int)pfVar22[0xf];
      auVar29 = vdivps_avx512f(auVar29,auVar26);
      pfVar22 = local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + uVar24;
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (bool)(bVar18 >> 1 & 1);
      bVar10 = (bool)(bVar18 >> 2 & 1);
      bVar11 = (bool)(bVar18 >> 3 & 1);
      bVar12 = (bool)(bVar18 >> 4 & 1);
      bVar13 = (bool)(bVar18 >> 5 & 1);
      bVar14 = (bool)(bVar18 >> 6 & 1);
      *pfVar22 = (float)((uint)(bVar17 & 1) * auVar29._0_4_ |
                        (uint)!(bool)(bVar17 & 1) * (int)*pfVar22);
      pfVar22[1] = (float)((uint)bVar2 * auVar29._4_4_ | (uint)!bVar2 * (int)pfVar22[1]);
      pfVar22[2] = (float)((uint)bVar3 * auVar29._8_4_ | (uint)!bVar3 * (int)pfVar22[2]);
      pfVar22[3] = (float)((uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * (int)pfVar22[3]);
      pfVar22[4] = (float)((uint)bVar5 * auVar29._16_4_ | (uint)!bVar5 * (int)pfVar22[4]);
      pfVar22[5] = (float)((uint)bVar6 * auVar29._20_4_ | (uint)!bVar6 * (int)pfVar22[5]);
      pfVar22[6] = (float)((uint)bVar7 * auVar29._24_4_ | (uint)!bVar7 * (int)pfVar22[6]);
      pfVar22[7] = (float)((uint)bVar8 * auVar29._28_4_ | (uint)!bVar8 * (int)pfVar22[7]);
      pfVar22[8] = (float)((uint)(bVar18 & 1) * auVar29._32_4_ |
                          (uint)!(bool)(bVar18 & 1) * (int)pfVar22[8]);
      pfVar22[9] = (float)((uint)bVar9 * auVar29._36_4_ | (uint)!bVar9 * (int)pfVar22[9]);
      pfVar22[10] = (float)((uint)bVar10 * auVar29._40_4_ | (uint)!bVar10 * (int)pfVar22[10]);
      pfVar22[0xb] = (float)((uint)bVar11 * auVar29._44_4_ | (uint)!bVar11 * (int)pfVar22[0xb]);
      pfVar22[0xc] = (float)((uint)bVar12 * auVar29._48_4_ | (uint)!bVar12 * (int)pfVar22[0xc]);
      pfVar22[0xd] = (float)((uint)bVar13 * auVar29._52_4_ | (uint)!bVar13 * (int)pfVar22[0xd]);
      pfVar22[0xe] = (float)((uint)bVar14 * auVar29._56_4_ | (uint)!bVar14 * (int)pfVar22[0xe]);
      pfVar22[0xf] = (float)((uint)(bVar18 >> 7) * auVar29._60_4_ |
                            (uint)!(bool)(bVar18 >> 7) * (int)pfVar22[0xf]);
      uVar24 = uVar24 + 0x10;
    } while ((((ulong)((long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish +
                      (-4 - (long)local_130.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) >> 2) + 0x10 &
             0xfffffffffffffff0) != uVar24);
  }
  TVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  ChannelNames_abi_cxx11_(&local_148,this,desc);
  pbVar19 = local_148.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar23 = (long)local_148.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_148.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_d0.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  AVar20.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = lVar23 >> 5;
  channels.ptr = pbVar19;
  Image(&local_c8,Float,(Point2i)TVar1,channels,&local_d0,AVar20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  local_15c = (undefined4)(desc->offset).nStored;
  iVar21 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  pcStack_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = operator_new(0x30);
  *(Image **)local_f8._M_unused._0_8_ = this;
  *(ImageChannelDesc **)((long)local_f8._M_unused._0_8_ + 8) = desc;
  *(uint **)((long)local_f8._M_unused._0_8_ + 0x10) = &local_164;
  *(undefined4 **)((long)local_f8._M_unused._0_8_ + 0x18) = &local_15c;
  *(vector<float,_std::allocator<float>_> **)((long)local_f8._M_unused._0_8_ + 0x20) = &local_130;
  *(Image **)((long)local_f8._M_unused._0_8_ + 0x28) = &local_c8;
  pcStack_e0 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:211:34)>
               ::_M_invoke;
  pcStack_e8 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:211:34)>
               ::_M_manager;
  ParallelFor(0,(long)iVar21,(function<void_(long,_long)> *)&local_f8);
  if (pcStack_e8 != (code *)0x0) {
    (*pcStack_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  TVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  ChannelNames_abi_cxx11_(&local_148,this,desc);
  local_d8.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  AVar20.memoryResource = pstd::pmr::new_delete_resource();
  channels_00.n =
       (long)local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  channels_00.ptr =
       local_148.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  Image(local_158,Float,(Point2i)TVar1,channels_00,&local_d8,AVar20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  iVar21 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  pcStack_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = operator_new(0x38);
  *(Image **)local_118._M_unused._0_8_ = this;
  *(ImageChannelDesc **)((long)local_118._M_unused._0_8_ + 8) = desc;
  *(uint **)((long)local_118._M_unused._0_8_ + 0x10) = &local_164;
  *(Image **)((long)local_118._M_unused._0_8_ + 0x18) = &local_c8;
  *(undefined4 **)((long)local_118._M_unused._0_8_ + 0x20) = &local_15c;
  *(vector<float,_std::allocator<float>_> **)((long)local_118._M_unused._0_8_ + 0x28) = &local_130;
  *(Image **)((long)local_118._M_unused._0_8_ + 0x30) = local_158;
  pcStack_100 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:228:34)>
                ::_M_invoke;
  pcStack_108 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:228:34)>
                ::_M_manager;
  ParallelFor(0,(long)iVar21,(function<void_(long,_long)> *)&local_118);
  if (pcStack_108 != (code *)0x0) {
    (*pcStack_108)(&local_118,&local_118,__destroy_functor);
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_c8.p32);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_c8.p16);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            (&local_c8.p8);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8.channelNames);
  if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_158;
}

Assistant:

Image Image::GaussianFilter(const ImageChannelDesc &desc, int halfWidth,
                            Float sigma) const {
    // Compute filter weights
    std::vector<Float> wts(2 * halfWidth + 1, Float(0));
    for (int d = 0; d < 2 * halfWidth + 1; ++d)
        wts[d] = Gaussian(d - halfWidth, 0, sigma);

    // Normalize weights
    Float wtSum = std::accumulate(wts.begin(), wts.end(), Float(0));
    for (Float &w : wts)
        w /= wtSum;

    // Separable blur; first blur in x into blurx, selecting out the
    // desired channels along the way.
    Image blurx(PixelFormat::Float, resolution, ChannelNames(desc));
    int nc = desc.size();
    ParallelFor(0, resolution.y, [&](int64_t y0, int64_t y1) {
        for (int y = y0; y < y1; ++y) {
            for (int x = 0; x < resolution.x; ++x) {
                ImageChannelValues result(desc.size());
                for (int r = -halfWidth; r <= halfWidth; ++r) {
                    ImageChannelValues cv = GetChannels({x + r, y}, desc);
                    for (int c = 0; c < nc; ++c)
                        result[c] += wts[r + halfWidth] * cv[c];
                }
                blurx.SetChannels({x, y}, result);
            }
        }
    });

    // Now blur in y from blur x to the result; blurx has just the
    // channels we want already.
    Image blury(PixelFormat::Float, resolution, ChannelNames(desc));
    ParallelFor(0, resolution.y, [&](int64_t y0, int64_t y1) {
        for (int y = y0; y < y1; ++y) {
            for (int x = 0; x < resolution.x; ++x) {
                ImageChannelValues result(desc.size());
                for (int r = -halfWidth; r <= halfWidth; ++r) {
                    ImageChannelValues cv = blurx.GetChannels({x, y + r});
                    for (int c = 0; c < nc; ++c)
                        result[c] += wts[r + halfWidth] * cv[c];
                }
                blury.SetChannels({x, y}, result);
            }
        }
    });
    return blury;
}